

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

void __thiscall
kj::StringTree::
fill<kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
          (StringTree *this,char *pos,size_t branchIndex,StringTree *first,StringTree *rest,
          ArrayPtr<const_char> *rest_1,String *rest_2,ArrayPtr<const_char> *rest_3,
          ArrayPtr<const_char> *rest_4,ArrayPtr<const_char> *rest_5,ArrayPtr<const_char> *rest_6,
          ArrayPtr<const_char> *rest_7,ArrayPtr<const_char> *rest_8,ArrayPtr<const_char> *rest_9,
          String *rest_10,ArrayPtr<const_char> *rest_11,CappedArray<char,_14UL> *rest_12,
          ArrayPtr<const_char> *rest_13,ArrayPtr<const_char> *rest_14,ArrayPtr<const_char> *rest_15,
          ArrayPtr<const_char> *rest_16,StringTree *rest_17,ArrayPtr<const_char> *rest_18,
          String *rest_19,ArrayPtr<const_char> *rest_20,ArrayPtr<const_char> *rest_21,
          ArrayPtr<const_char> *rest_22,ArrayPtr<const_char> *rest_23,ArrayPtr<const_char> *rest_24,
          ArrayPtr<const_char> *rest_25,ArrayPtr<const_char> *rest_26,String *rest_27,
          ArrayPtr<const_char> *rest_28,CappedArray<char,_14UL> *rest_29,
          ArrayPtr<const_char> *rest_30,ArrayPtr<const_char> *rest_31,ArrayPtr<const_char> *rest_32,
          ArrayPtr<const_char> *rest_33,StringTree *rest_34,ArrayPtr<const_char> *rest_35,
          ArrayPtr<const_char> *rest_36,ArrayPtr<const_char> *rest_37,ArrayPtr<const_char> *rest_38,
          ArrayPtr<const_char> *rest_39,String *rest_40,ArrayPtr<const_char> *rest_41,
          ArrayPtr<const_char> *rest_42,ArrayPtr<const_char> *rest_43,String *rest_44,
          ArrayPtr<const_char> *rest_45,CappedArray<char,_14UL> *rest_46,
          ArrayPtr<const_char> *rest_47,ArrayPtr<const_char> *rest_48,ArrayPtr<const_char> *rest_49,
          ArrayPtr<const_char> *rest_50)

{
  Branch *pBVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  Branch *pBVar4;
  char *pcVar5;
  
  pcVar5 = (char *)(this->text).content.size_;
  pBVar1 = (this->branches).ptr;
  if (pcVar5 != (char *)0x0) {
    pcVar5 = (this->text).content.ptr;
  }
  pBVar1[branchIndex].index = (long)pos - (long)pcVar5;
  pBVar1[branchIndex].content.size_ = first->size_;
  pcVar5 = pBVar1[branchIndex].content.text.content.ptr;
  if (pcVar5 != (char *)0x0) {
    sVar2 = pBVar1[branchIndex].content.text.content.size_;
    pBVar1[branchIndex].content.text.content.ptr = (char *)0x0;
    pBVar1[branchIndex].content.text.content.size_ = 0;
    pAVar3 = pBVar1[branchIndex].content.text.content.disposer;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pcVar5,1,sVar2,sVar2,0);
  }
  pBVar1[branchIndex].content.text.content.ptr = (first->text).content.ptr;
  pBVar1[branchIndex].content.text.content.size_ = (first->text).content.size_;
  pBVar1[branchIndex].content.text.content.disposer = (first->text).content.disposer;
  (first->text).content.ptr = (char *)0x0;
  (first->text).content.size_ = 0;
  pBVar4 = pBVar1[branchIndex].content.branches.ptr;
  if (pBVar4 != (Branch *)0x0) {
    sVar2 = pBVar1[branchIndex].content.branches.size_;
    pBVar1[branchIndex].content.branches.ptr = (Branch *)0x0;
    pBVar1[branchIndex].content.branches.size_ = 0;
    pAVar3 = pBVar1[branchIndex].content.branches.disposer;
    (**pAVar3->_vptr_ArrayDisposer)
              (pAVar3,pBVar4,0x40,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  pBVar1[branchIndex].content.branches.ptr = (first->branches).ptr;
  pBVar1[branchIndex].content.branches.size_ = (first->branches).size_;
  pBVar1[branchIndex].content.branches.disposer = (first->branches).disposer;
  (first->branches).ptr = (Branch *)0x0;
  (first->branches).size_ = 0;
  fill<kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (this,pos,branchIndex + 1,rest,rest_1,rest_2,rest_3,rest_4,rest_5,rest_6,rest_7,rest_8,
             rest_9,rest_10,rest_11,rest_12,rest_13,rest_14,rest_15,rest_16,rest_17,rest_18,rest_19,
             rest_20,rest_21,rest_22,rest_23,rest_24,rest_25,rest_26,rest_27,rest_28,rest_29,rest_30
             ,rest_31,rest_32,rest_33,rest_34,rest_35,rest_36,rest_37,rest_38,rest_39,rest_40,
             rest_41,rest_42,rest_43,rest_44,rest_45,rest_46,rest_47,rest_48,rest_49,rest_50);
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, StringTree&& first, Rest&&... rest) {
  branches[branchIndex].index = pos - text.begin();
  branches[branchIndex].content = kj::mv(first);
  fill(pos, branchIndex + 1, kj::fwd<Rest>(rest)...);
}